

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

attr_list ContactWriter(SstStream Stream,char *Filename,SstParams Params,SMPI_Comm comm,
                       CMConnection *conn_p,void **WriterFileID_p)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  SstStream in_RCX;
  long in_RDI;
  attr_list in_R8;
  undefined8 in_R9;
  char *Buffer;
  attr_list WriterRank0Contact;
  CMConnection conn;
  char *CMContactString;
  char *Writer0Contact;
  attr_list RetVal;
  int DataSize;
  SMPI_Comm in_stack_00000108;
  int in_stack_00000114;
  SMPI_Datatype in_stack_00000118;
  int in_stack_0000011c;
  void *in_stack_00000120;
  attr_list in_stack_00000d30;
  CManager in_stack_00000d38;
  int in_stack_ffffffffffffff8c;
  SstStream in_stack_ffffffffffffff90;
  CPNetworkInfoFunc p_Var4;
  char *in_stack_ffffffffffffff98;
  CMConnection local_58;
  char *local_50;
  attr_list local_40;
  int local_34;
  
  local_40 = (attr_list)0x0;
  if (*(int *)(in_RDI + 0xa8) == 0) {
    pcVar1 = readContactInfo(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff8c);
    local_50 = (char *)0x0;
    local_58 = (CMConnection)0x0;
    if (pcVar1 != (char *)0x0) {
      sVar2 = strlen(pcVar1);
      local_50 = (char *)malloc(sVar2 + 1);
      __isoc99_sscanf(pcVar1,"%p:%s",in_R9,local_50);
      free(pcVar1);
      if (globalNetinfoCallback != (CPNetworkInfoFunc)0x0) {
        p_Var4 = globalNetinfoCallback;
        pcVar1 = CP_GetContactString(in_RCX,in_R8);
        (*p_Var4)(1,pcVar1,IPDiagString);
        (*globalNetinfoCallback)(2,local_50,(char *)0x0);
      }
      uVar3 = attr_list_from_string(local_50);
      local_58 = Tunneling_get_conn(in_stack_00000d38,in_stack_00000d30);
      free_attr_list(uVar3);
    }
    if (local_58 == (CMConnection)0x0) {
      local_34 = 0;
      *(undefined8 *)in_R8 = 0;
    }
    else {
      sVar2 = strlen(local_50);
      local_34 = (int)sVar2 + 1;
      *(CMConnection *)in_R8 = local_58;
    }
    SMPI_Bcast(in_stack_00000120,in_stack_0000011c,in_stack_00000118,in_stack_00000114,
               in_stack_00000108);
    if (local_34 != 0) {
      SMPI_Bcast(in_stack_00000120,in_stack_0000011c,in_stack_00000118,in_stack_00000114,
                 in_stack_00000108);
      local_40 = (attr_list)attr_list_from_string(local_50);
    }
    if (local_50 != (char *)0x0) {
      free(local_50);
    }
  }
  else {
    SMPI_Bcast(in_stack_00000120,in_stack_0000011c,in_stack_00000118,in_stack_00000114,
               in_stack_00000108);
    local_40 = (attr_list)0x0;
  }
  return local_40;
}

Assistant:

attr_list ContactWriter(SstStream Stream, char *Filename, SstParams Params, SMPI_Comm comm,
                        CMConnection *conn_p, void **WriterFileID_p)
{
    int DataSize = 0;
    attr_list RetVal = NULL;

    if (Stream->Rank == 0)
    {
        char *Writer0Contact = readContactInfo(Filename, Stream, Params->OpenTimeoutSecs);
        char *CMContactString = NULL;
        CMConnection conn = NULL;
        attr_list WriterRank0Contact;

        if (Writer0Contact)
        {

            CMContactString = malloc(strlen(Writer0Contact) + 1); /* +1 for null terminator */
            sscanf(Writer0Contact, "%p:%s", WriterFileID_p, CMContactString);
            //        printf("Writer contact info is fileID %p, contact info
            //        %s\n",
            //               WriterFileID, CMContactString);
            free(Writer0Contact);

            if (globalNetinfoCallback)
            {
                (globalNetinfoCallback)(1, CP_GetContactString(Stream, NULL), IPDiagString);
                (globalNetinfoCallback)(2, CMContactString, NULL);
            }
            WriterRank0Contact = attr_list_from_string(CMContactString);
            conn = Tunneling_get_conn(Stream->CPInfo->SharedCM->cm, WriterRank0Contact);
            free_attr_list(WriterRank0Contact);
        }
        if (conn)
        {
            DataSize = (int)strlen(CMContactString) + 1;
            *conn_p = conn;
        }
        else
        {
            DataSize = 0;
            *conn_p = NULL;
        }
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        if (DataSize != 0)
        {
            SMPI_Bcast(CMContactString, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
            RetVal = attr_list_from_string(CMContactString);
        }
        if (CMContactString)
            free(CMContactString);
    }
    else
    {
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        if (DataSize != 0)
        {
            char *Buffer = malloc(DataSize);
            SMPI_Bcast(Buffer, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
            RetVal = attr_list_from_string(Buffer);
            free(Buffer);
        }
    }
    return RetVal;
}